

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidgetItem *item,IteratorFlags flags)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QTreeWidgetItemIteratorPrivate *this_00;
  QTreeWidgetItemIteratorPrivate *pQVar4;
  QTreeWidgetItem *this_01;
  undefined4 in_EDX;
  QTreeWidgetItem *in_RSI;
  QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
  *in_RDI;
  long in_FS_OFFSET;
  int index;
  QTreeWidgetItem *itm;
  QTreeWidgetItem *root;
  QTreeWidgetItem *parent;
  QTreeModel *model;
  QTreeWidgetItemIteratorPrivate *d;
  undefined4 in_stack_ffffffffffffff88;
  parameter_type in_stack_ffffffffffffff8c;
  QTreeWidgetItem *in_stack_ffffffffffffff90;
  QTreeWidgetItemIterator *in_stack_ffffffffffffff98;
  QTreeWidgetItem *achild;
  QTreeWidgetItem *item_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTreeWidgetItemIteratorPrivate *)operator_new(0x30);
  QAbstractItemView::model((QAbstractItemView *)this_00);
  qobject_cast<QTreeModel*>((QObject *)0x932813);
  QTreeWidgetItemIteratorPrivate::QTreeWidgetItemIteratorPrivate
            (this_00,in_stack_ffffffffffffff98,(QTreeModel *)in_stack_ffffffffffffff90);
  QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
  ::QScopedPointer(in_RDI,this_00);
  in_RDI[1].d = (QTreeWidgetItemIteratorPrivate *)in_RSI;
  *(undefined4 *)&in_RDI[2].d = in_EDX;
  pQVar4 = d_func((QTreeWidgetItemIterator *)0x93284e);
  QAbstractItemView::model((QAbstractItemView *)this_00);
  qobject_cast<QTreeModel*>((QObject *)0x932869);
  QList<QTreeWidgetItemIterator_*>::append
            ((QList<QTreeWidgetItemIterator_*> *)0x932881,
             (parameter_type)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  this_01 = QTreeWidgetItem::parent(in_RSI);
  item_00 = pQVar4->m_model->rootItem;
  achild = item_00;
  if (this_01 != (QTreeWidgetItem *)0x0) {
    achild = this_01;
  }
  iVar3 = QTreeWidgetItem::indexOfChild(in_stack_ffffffffffffff90,achild);
  pQVar4->m_currentIndex = iVar3;
  while (this_01 != (QTreeWidgetItem *)0x0) {
    this_01 = QTreeWidgetItem::parent(this_01);
    in_stack_ffffffffffffff90 = item_00;
    if (this_01 != (QTreeWidgetItem *)0x0) {
      in_stack_ffffffffffffff90 = this_01;
    }
    QTreeWidgetItem::indexOfChild(in_stack_ffffffffffffff90,achild);
    QList<int>::prepend((QList<int> *)0x932946,in_stack_ffffffffffffff8c);
  }
  if ((in_RDI[1].d != (QTreeWidgetItemIteratorPrivate *)0x0) &&
     (bVar2 = matchesFlags((QTreeWidgetItemIterator *)0x0,item_00), !bVar2)) {
    operator++((QTreeWidgetItemIterator *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidgetItem *item, IteratorFlags flags)
    : d_ptr(new QTreeWidgetItemIteratorPrivate(
                this, qobject_cast<QTreeModel*>(item->view->model()))),
      current(item), flags(flags)
{
    Q_D(QTreeWidgetItemIterator);
    Q_ASSERT(item);
    QTreeModel *model = qobject_cast<QTreeModel*>(item->view->model());
    Q_ASSERT(model);
    model->iterators.append(this);

    // Initialize m_currentIndex and m_parentIndex as it would be if we had traversed from
    // the beginning.
    QTreeWidgetItem *parent = item;
    parent = parent->parent();
    QTreeWidgetItem *root = d->m_model->rootItem;
    d->m_currentIndex = (parent ? parent : root)->indexOfChild(item);

    while (parent) {
        QTreeWidgetItem *itm = parent;
        parent = parent->parent();
        const int index = (parent ? parent : root)->indexOfChild(itm);
        d->m_parentIndex.prepend(index);
    }

    if (current && !matchesFlags(current))
        ++(*this);
}